

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

ClauseIterator __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants
          (SubstitutionTreeClauseVariantIndex *this,Literal **lits,uint length)

{
  Iterator it;
  Iterator it_00;
  bool bVar1;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar2;
  int in_ECX;
  DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RSI;
  FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *in_RDI;
  Literal *mainLit;
  LiteralSubstitutionTree *index;
  ClauseList *lst;
  FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *this_00;
  uint in_stack_fffffffffffffee4;
  Literal **in_stack_fffffffffffffee8;
  ResultClauseToVariantClauseFn *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  LiteralSubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffff08;
  SubstitutionTreeClauseVariantIndex *in_stack_ffffffffffffff10;
  CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>
  *in_stack_ffffffffffffff20;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  *in_stack_ffffffffffffff28;
  FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *in_stack_ffffffffffffff38;
  undefined1 local_c0 [48];
  undefined1 local_90 [72];
  Literal *local_48;
  LiteralSubstitutionTree<Indexing::LiteralClause> *local_40;
  Iterator local_38;
  List<Kernel::Clause_*> *local_30;
  Iterator local_28 [5];
  
  if (in_ECX == 0) {
    Lib::List<Kernel::Clause_*>::Iterator::Iterator
              (local_28,(List<Kernel::Clause_*> *)in_RSI[1]._afterLast);
    it._lst._6_1_ = in_stack_fffffffffffffefe;
    it._lst._0_6_ = in_stack_fffffffffffffef8;
    it._lst._7_1_ = in_stack_fffffffffffffeff;
    Lib::pvi<Lib::List<Kernel::Clause*>::Iterator>(it);
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    if ((in_ECX == 1) && (bVar1 = Kernel::Term::ground((Term *)0x2fdcff), bVar1)) {
      bVar1 = Lib::
              DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::find(in_RSI,(Literal **)this_00,(List<Kernel::Clause_*> **)in_RDI);
      if (bVar1) {
        Lib::List<Kernel::Clause_*>::Iterator::Iterator(&local_38,local_30);
        it_00._lst._6_1_ = in_stack_fffffffffffffefe;
        it_00._lst._0_6_ = in_stack_fffffffffffffef8;
        it_00._lst._7_1_ = in_stack_fffffffffffffeff;
        Lib::pvi<Lib::List<Kernel::Clause*>::Iterator>(it_00);
      }
      else {
        Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
      }
    }
    else {
      ppLVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                          ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                           this_00,(size_t)in_RDI);
      local_40 = *ppLVar2;
      if (local_40 == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
      }
      else {
        local_48 = getMainLiteral(in_stack_ffffffffffffff10,(Literal **)in_stack_ffffffffffffff08,
                                  in_stack_ffffffffffffff04);
        LiteralSubstitutionTree<Indexing::LiteralClause>::getVariants
                  (in_stack_ffffffffffffff08,
                   (Literal *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
        ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
        Lib::
        getCompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants(Kernel::Literal*const*,unsigned_int)::__0>
                  (&stack0xffffffffffffff10,&stack0xfffffffffffffef0);
        Lib::
        getMappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::LiteralClause>>,Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants(Kernel::Literal*const*,unsigned_int)::__0>>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        Lib::
        getFilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::LiteralClause>>,Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants(Kernel::Literal*const*,unsigned_int)::__0>,Kernel::Clause*>,Lib::NonzeroFn>
                  (local_90,local_c0);
        Lib::
        pvi<Lib::FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::LiteralClause>>,Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants(Kernel::Literal*const*,unsigned_int)::__0>,Kernel::Clause*>,Lib::NonzeroFn,false>>
                  (in_stack_ffffffffffffff38);
        Lib::
        FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
        ::~FilteredIterator(this_00);
        Lib::
        MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
        ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
                            *)this_00);
        Lib::
        CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>
        ::~CompositionFn((CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>
                          *)0x2fde68);
        ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
                  ((ResultClauseToVariantClauseFn *)0x2fde72);
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                            *)this_00);
      }
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this_00;
}

Assistant:

ClauseIterator SubstitutionTreeClauseVariantIndex::retrieveVariants(Literal* const * lits, unsigned length)
{
  if(length==0) {
    return pvi( ClauseList::Iterator(_emptyClauses) );
  }
  if(length==1 && lits[0]->ground()) {
    ClauseList* lst;
    if(_groundUnits.find(lits[0], lst)) {
      ASS(lst);
      return pvi( ClauseList::Iterator(lst) );
    }
    else {
      return ClauseIterator::getEmpty();
    }
  }

  LiteralSubstitutionTree* index=_strees[length];
  if(!index) {
    return ClauseIterator::getEmpty();
  }

  Literal* mainLit=getMainLiteral(lits, length);
  return pvi( getFilteredIterator(
    getMappingIterator(
      index->getVariants(mainLit, false, false),
      getCompositionFn(ResultClauseToVariantClauseFn(lits, length),[](auto qr) { return qr.data->clause; })),
    NonzeroFn()) );
}